

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O2

void anon_unknown.dwarf_b4f9::verifyLevelsAreEqual
               (FlatImageLevel *level1,FlatImageLevel *level2,int dx,int dy)

{
  float fVar1;
  int iVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  ostream *poVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  int *piVar16;
  ArgExc *this;
  int iVar17;
  int iVar18;
  
  if ((((*(int *)(level1 + 0x18) == *(int *)(level2 + 0x18) - dx) &&
       (*(int *)(level1 + 0x1c) == *(int *)(level2 + 0x1c) - dy)) &&
      (*(int *)(level1 + 0x20) == *(int *)(level2 + 0x20) - dx)) &&
     (*(int *)(level1 + 0x24) == *(int *)(level2 + 0x24) - dy)) {
    p_Var9 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::begin();
    for (p_Var10 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::begin();
        (p_Var11 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end(), p_Var9 != p_Var11 &&
        (p_Var11 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end(), p_Var10 != p_Var11));
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      poVar12 = std::operator<<((ostream *)&std::cout,"            channel ");
      poVar12 = std::operator<<(poVar12,(string *)(p_Var9 + 1));
      std::endl<char,std::char_traits<char>>(poVar12);
      bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var9 + 1),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var10 + 1));
      if (bVar6) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"different channel names");
        goto LAB_00108820;
      }
      iVar7 = (**(code **)**(undefined8 **)(p_Var9 + 2))();
      iVar8 = (**(code **)**(undefined8 **)(p_Var10 + 2))();
      if (iVar7 != iVar8) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"different channel types");
        goto LAB_00108820;
      }
      puVar3 = *(undefined8 **)(p_Var9 + 2);
      lVar4 = *(long *)(p_Var10 + 2);
      if ((*(int *)(puVar3 + 2) != *(int *)(lVar4 + 0x10)) ||
         (*(int *)((long)puVar3 + 0x14) != *(int *)(lVar4 + 0x14))) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"different channel sampling rates");
        goto LAB_00108820;
      }
      if (*(char *)(puVar3 + 3) != *(char *)(lVar4 + 0x18)) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"different channel types");
        goto LAB_00108820;
      }
      iVar7 = (**(code **)*puVar3)();
      if (iVar7 == 0) {
        lVar4 = *(long *)(p_Var9 + 2);
        lVar13 = __dynamic_cast(lVar4,&Imf_3_2::FlatImageChannel::typeinfo,
                                &Imf_3_2::TypedFlatImageChannel<unsigned_int>::typeinfo,0);
        if ((lVar13 == 0) ||
           (lVar14 = __dynamic_cast(*(undefined8 *)(p_Var10 + 2),
                                    &Imf_3_2::FlatImageChannel::typeinfo,
                                    &Imf_3_2::TypedFlatImageChannel<unsigned_int>::typeinfo,0),
           lVar14 == 0)) {
LAB_00108852:
          __cxa_bad_cast();
        }
        lVar5 = *(long *)(lVar4 + 8);
        iVar7 = *(int *)(lVar4 + 0x10);
        iVar8 = *(int *)(lVar4 + 0x14);
        for (iVar18 = *(int *)(lVar5 + 0x1c); iVar18 <= *(int *)(lVar5 + 0x24);
            iVar18 = iVar18 + iVar8) {
          iVar17 = *(int *)(lVar5 + 0x18);
          while (iVar17 <= *(int *)(lVar5 + 0x20)) {
            piVar16 = (int *)Imf_3_2::TypedFlatImageChannel<unsigned_int>::at((int)lVar13,iVar17);
            iVar2 = *piVar16;
            piVar16 = (int *)Imf_3_2::TypedFlatImageChannel<unsigned_int>::at
                                       ((int)lVar14,dx + iVar17);
            iVar17 = iVar17 + iVar7;
            if (iVar2 != *piVar16) {
              this = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(this,"different pixel values");
              goto LAB_00108820;
            }
          }
        }
      }
      else if (iVar7 == 2) {
        lVar4 = *(long *)(p_Var9 + 2);
        lVar13 = __dynamic_cast(lVar4,&Imf_3_2::FlatImageChannel::typeinfo,
                                &Imf_3_2::TypedFlatImageChannel<float>::typeinfo,0);
        if ((lVar13 == 0) ||
           (lVar14 = __dynamic_cast(*(undefined8 *)(p_Var10 + 2),
                                    &Imf_3_2::FlatImageChannel::typeinfo,
                                    &Imf_3_2::TypedFlatImageChannel<float>::typeinfo,0), lVar14 == 0
           )) goto LAB_00108852;
        lVar5 = *(long *)(lVar4 + 8);
        iVar7 = *(int *)(lVar4 + 0x10);
        iVar8 = *(int *)(lVar4 + 0x14);
        for (iVar18 = *(int *)(lVar5 + 0x1c); iVar18 <= *(int *)(lVar5 + 0x24);
            iVar18 = iVar18 + iVar8) {
          iVar17 = *(int *)(lVar5 + 0x18);
          while (iVar17 <= *(int *)(lVar5 + 0x20)) {
            pfVar15 = (float *)Imf_3_2::TypedFlatImageChannel<float>::at((int)lVar13,iVar17);
            fVar1 = *pfVar15;
            pfVar15 = (float *)Imf_3_2::TypedFlatImageChannel<float>::at((int)lVar14,dx + iVar17);
            iVar17 = iVar17 + iVar7;
            if ((fVar1 != *pfVar15) || (NAN(fVar1) || NAN(*pfVar15))) {
              this = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(this,"different pixel values");
              goto LAB_00108820;
            }
          }
        }
      }
      else {
        if (iVar7 != 1) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                        ,0x66,
                        "void (anonymous namespace)::verifyLevelsAreEqual(const FlatImageLevel &, const FlatImageLevel &, int, int)"
                       );
        }
        verifyPixelsAreEqual<Imath_3_2::half>
                  (*(FlatImageChannel **)(p_Var9 + 2),*(FlatImageChannel **)(p_Var10 + 2),dx,dy);
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    }
    p_Var11 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end();
    if ((p_Var9 == p_Var11) &&
       (p_Var9 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end(), p_Var10 == p_Var9)) {
      return;
    }
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different channel lists");
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different data windows");
  }
LAB_00108820:
  __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
verifyLevelsAreEqual (
    const FlatImageLevel& level1, const FlatImageLevel& level2, int dx, int dy)
{
    if (level1.dataWindow ().min.x != level2.dataWindow ().min.x - dx ||
        level1.dataWindow ().min.y != level2.dataWindow ().min.y - dy ||
        level1.dataWindow ().max.x != level2.dataWindow ().max.x - dx ||
        level1.dataWindow ().max.y != level2.dataWindow ().max.y - dy)
    {
        throw ArgExc ("different data windows");
    }

    FlatImageLevel::ConstIterator i1 = level1.begin ();
    FlatImageLevel::ConstIterator i2 = level2.begin ();

    while (i1 != level1.end () && i2 != level2.end ())
    {
        cout << "            channel " << i1.name () << endl;

        if (i1.name () != i2.name ()) throw ArgExc ("different channel names");

        if (i1.channel ().pixelType () != i2.channel ().pixelType ())
            throw ArgExc ("different channel types");

        if (i1.channel ().xSampling () != i2.channel ().xSampling () ||
            i1.channel ().ySampling () != i2.channel ().ySampling ())
            throw ArgExc ("different channel sampling rates");

        if (i1.channel ().pLinear () != i2.channel ().pLinear ())
            throw ArgExc ("different channel types");

        switch (i1.channel ().pixelType ())
        {
            case HALF:

                verifyPixelsAreEqual<half> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case FLOAT:

                verifyPixelsAreEqual<float> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case UINT:

                verifyPixelsAreEqual<unsigned int> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            default: assert (false);
        }

        ++i1;
        ++i2;
    }

    if (i1 != level1.end () || i2 != level2.end ())
        throw ArgExc ("different channel lists");
}